

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O3

int nni_sock_add_listener(nni_sock *s,nni_listener *l)

{
  nni_type t;
  uint64_t uVar1;
  int iVar2;
  char *name;
  long lVar3;
  nni_mtx *mtx;
  undefined1 local_50 [8];
  uint64_t val;
  int local_3c;
  nni_listener *local_38;
  
  iVar2 = nni_listener_hold(l);
  if (iVar2 == 0) {
    name = "reconnect-time-min";
    lVar3 = 0x10;
    val = (uint64_t)s;
    local_38 = l;
    do {
      t = *(nni_type *)(pipe_stats_init_listener_info + lVar3 + 0x18);
      iVar2 = nni_sock_getopt((nni_sock *)val,name,local_50,(size_t *)0x0,t);
      if (iVar2 == 0) {
        iVar2 = nni_listener_setopt(local_38,name,local_50,0,t);
      }
      if ((iVar2 != 0) && (iVar2 != 9)) {
        nni_listener_rele(local_38);
        local_3c = iVar2;
      }
      uVar1 = val;
      if ((iVar2 != 9) && (iVar2 != 0)) {
        return local_3c;
      }
      name = *(char **)((long)&ep_options[0].eo_name + lVar3);
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x40);
    mtx = (nni_mtx *)(val + 0x10);
    nni_mtx_lock(mtx);
    if (*(char *)(uVar1 + 0x220) == '\x01') {
      nni_mtx_unlock(mtx);
      nni_listener_rele(local_38);
      iVar2 = 7;
    }
    else {
      nni_list_append((nni_list *)(uVar1 + 0x1c0),local_38);
      nni_stat_inc((nni_stat_item *)(uVar1 + 0x398),1);
      nni_mtx_unlock(mtx);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
nni_sock_add_listener(nni_sock *s, nni_listener *l)
{
	int rv;

	// grab a hold on the listener for the socket
	if ((rv = nni_listener_hold(l)) != 0) {
		return (rv);
	}

	// copy initial values for some options from socket
	for (int i = 0; ep_options[i].eo_name != NULL; i++) {
		uint64_t             val; // big enough
		const nni_ep_option *o = &ep_options[i];
		rv = nni_sock_getopt(s, o->eo_name, &val, NULL, o->eo_type);
		if (rv == 0) {
			rv = nni_listener_setopt(
			    l, o->eo_name, &val, 0, o->eo_type);
		}
		if (rv != 0 && rv != NNG_ENOTSUP) {
			nni_listener_rele(l);
			return (rv);
		}
	}

	nni_mtx_lock(&s->s_mx);
	if (s->s_closing) {
		nni_mtx_unlock(&s->s_mx);
		nni_listener_rele(l);
		return (NNG_ECLOSED);
	}

	nni_list_append(&s->s_listeners, l);

#ifdef NNG_ENABLE_STATS
	nni_stat_inc(&s->st_listeners, 1);
#endif

	nni_mtx_unlock(&s->s_mx);
	return (0);
}